

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

int32_t charIterTextExtract(UText *ut,int64_t start,int64_t limit,UChar *dest,int32_t destCapacity,
                           UErrorCode *status)

{
  CharacterIterator *this;
  UBool UVar1;
  int iVar2;
  uint uVar3;
  int32_t iVar4;
  int iVar5;
  int32_t len;
  UChar32 c;
  CharacterIterator *ci;
  int32_t copyLimit;
  int32_t srci;
  int32_t desti;
  int32_t limit32;
  int32_t start32;
  int32_t length;
  UErrorCode *status_local;
  int32_t destCapacity_local;
  UChar *dest_local;
  int64_t limit_local;
  int64_t start_local;
  UText *ut_local;
  
  dest_local = (UChar *)limit;
  limit_local = start;
  start_local = (int64_t)ut;
  UVar1 = U_FAILURE(*status);
  if (UVar1 == '\0') {
    if ((destCapacity < 0) ||
       (((dest == (UChar *)0x0 && (0 < destCapacity)) || ((long)dest_local < limit_local)))) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      ut_local._4_4_ = 0;
    }
    else {
      iVar2 = (int)*(undefined8 *)(start_local + 0x70);
      uVar3 = pinIndex(&limit_local,(long)iVar2);
      iVar4 = pinIndex((int64_t *)&dest_local,(long)iVar2);
      copyLimit = 0;
      this = *(CharacterIterator **)(start_local + 0x48);
      (*(this->super_ForwardCharacterIterator).super_UObject._vptr_UObject[0x10])(this,(ulong)uVar3)
      ;
      ci._0_4_ = icu_63::CharacterIterator::getIndex(this);
      for (ci._4_4_ = (int)ci; ci._4_4_ < iVar4; ci._4_4_ = iVar2 + ci._4_4_) {
        uVar3 = (*(this->super_ForwardCharacterIterator).super_UObject._vptr_UObject[6])();
        iVar2 = 2;
        if (uVar3 < 0x10000) {
          iVar2 = 1;
        }
        if (destCapacity < copyLimit + iVar2) {
          copyLimit = iVar2 + copyLimit;
          *status = U_BUFFER_OVERFLOW_ERROR;
        }
        else {
          if (uVar3 < 0x10000) {
            dest[copyLimit] = (UChar)uVar3;
            copyLimit = copyLimit + 1;
          }
          else {
            iVar5 = copyLimit + 1;
            dest[copyLimit] = (short)((int)uVar3 >> 10) + L'ퟀ';
            copyLimit = copyLimit + 2;
            dest[iVar5] = (UChar)uVar3 & 0x3ffU | 0xdc00;
          }
          ci._0_4_ = ci._4_4_ + iVar2;
        }
      }
      charIterTextAccess((UText *)start_local,(long)(int)ci,'\x01');
      u_terminateUChars_63(dest,destCapacity,copyLimit,status);
      ut_local._4_4_ = copyLimit;
    }
  }
  else {
    ut_local._4_4_ = 0;
  }
  return ut_local._4_4_;
}

Assistant:

static int32_t U_CALLCONV
charIterTextExtract(UText *ut,
                  int64_t start, int64_t limit,
                  UChar *dest, int32_t destCapacity,
                  UErrorCode *status)
{
    if(U_FAILURE(*status)) {
        return 0;
    }
    if(destCapacity<0 || (dest==NULL && destCapacity>0) || start>limit) {
        *status=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    int32_t  length  = (int32_t)ut->a;
    int32_t  start32 = pinIndex(start, length);
    int32_t  limit32 = pinIndex(limit, length);
    int32_t  desti   = 0;
    int32_t  srci;
    int32_t  copyLimit;

    CharacterIterator *ci = (CharacterIterator *)ut->context;
    ci->setIndex32(start32);   // Moves ix to lead of surrogate pair, if needed.
    srci = ci->getIndex();
    copyLimit = srci;
    while (srci<limit32) {
        UChar32 c = ci->next32PostInc();
        int32_t  len = U16_LENGTH(c);
        U_ASSERT(desti+len>0); /* to ensure desti+len never exceeds MAX_INT32, which must not happen logically */
        if (desti+len <= destCapacity) {
            U16_APPEND_UNSAFE(dest, desti, c);
            copyLimit = srci+len;
        } else {
            desti += len;
            *status = U_BUFFER_OVERFLOW_ERROR;
        }
        srci += len;
    }

    charIterTextAccess(ut, copyLimit, TRUE);

    u_terminateUChars(dest, destCapacity, desti, status);
    return desti;
}